

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::GammaP_asympt<long_double>(longdouble a,longdouble x)

{
  longdouble *plVar1;
  double __x;
  double dVar2;
  double in_XMM1_Qa;
  longdouble correction;
  longdouble leading;
  longdouble eta;
  longdouble eta_squared_half;
  longdouble mu;
  longdouble in_stack_000001c0;
  longdouble in_stack_000001d0;
  longdouble in_stack_000001e0;
  undefined2 in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb2;
  undefined2 in_stack_ffffffffffffffb8;
  
  mln1p<long_double>((longdouble)
                     CONCAT28(in_stack_ffffffffffffffb8,
                              CONCAT62(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)));
  dVar2 = std::sqrt(__x);
  dVar2 = std::copysign(dVar2,in_XMM1_Qa);
  dVar2 = std::sqrt(dVar2);
  std::erfc(dVar2);
  plVar1 = GammaPQ_asympt_R<long_double>(in_stack_000001e0,in_stack_000001d0,in_stack_000001c0);
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_asympt(T a, T x) {
        const T mu{(x - a) / a};
        const T eta_squared_half{mln1p(mu)};
        const T eta{copysign(sqrt(2 * eta_squared_half), mu)};
        const T leading{erfc(-eta * sqrt(a / 2)) / 2};
        const T correction{-GammaPQ_asympt_R(a, eta, eta_squared_half)};
        return leading + correction;
      }